

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  long lVar9;
  string shader_source;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  TestShaderType local_1c4;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::GL> *local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar8 = 0;
  local_1c4 = tested_shader_type;
  local_60 = this;
  while (supported_variable_types_map._16_8_ != 0) {
    iVar1 = (&opaque_var_types)[lVar8];
    lVar9 = 0x21e5b78;
    lVar5 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar5 + 0x20)) {
        lVar9 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < iVar1) * 8);
    } while (lVar5 != 0);
    if ((lVar9 == 0x21e5b78) || (iVar1 < *(int *)(lVar9 + 0x20))) break;
    local_58 = lVar8;
    std::operator+(&local_50,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar9 + 0x48));
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_100 = &local_f0;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = plVar2[3];
    }
    else {
      local_f0 = *plVar6;
      local_100 = (long *)*plVar2;
    }
    local_f8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_100,*(ulong *)(lVar9 + 0x28));
    local_248 = &local_238;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_238 = *plVar6;
      lStack_230 = plVar2[3];
    }
    else {
      local_238 = *plVar6;
      local_248 = (long *)*plVar2;
    }
    local_240 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_1c0 = &local_1b0;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1b0 = *plVar6;
      lStack_1a8 = plVar2[3];
    }
    else {
      local_1b0 = *plVar6;
      local_1c0 = (long *)*plVar2;
    }
    local_1b8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1c0,*(ulong *)(lVar9 + 0x48));
    local_180 = &local_170;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_170 = *plVar6;
      lStack_168 = plVar2[3];
    }
    else {
      local_170 = *plVar6;
      local_180 = (long *)*plVar2;
    }
    local_178 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_180);
    local_160 = &local_150;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_150 = *plVar6;
      lStack_148 = plVar2[3];
    }
    else {
      local_150 = *plVar6;
      local_160 = (long *)*plVar2;
    }
    local_158 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_160,*(ulong *)(lVar9 + 0x28));
    local_120 = &local_110;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_110 = *plVar6;
      lStack_108 = plVar2[3];
    }
    else {
      local_110 = *plVar6;
      local_120 = (long *)*plVar2;
    }
    local_118 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_e0 = &local_d0;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_d0 = *plVar6;
      lStack_c8 = plVar2[3];
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*plVar2;
    }
    local_d8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,*(ulong *)(lVar9 + 0x48));
    local_c0 = &local_b0;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar2[3];
    }
    else {
      local_b0 = *plVar6;
      local_c0 = (long *)*plVar2;
    }
    local_b8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_a0 = &local_90;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_90 = *plVar6;
      lStack_88 = plVar2[3];
    }
    else {
      local_90 = *plVar6;
      local_a0 = (long *)*plVar2;
    }
    local_98 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,*(ulong *)(lVar9 + 0x28));
    local_80 = &local_70;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar2[3];
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    psVar7 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_228.field_2._M_allocated_capacity = *psVar7;
      local_228.field_2._8_8_ = plVar2[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar7;
      local_228._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_228._M_string_length = plVar2[1];
    *plVar2 = (long)psVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_228,*(ulong *)(lVar9 + 0x48));
    local_288 = &local_278;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_278 = *plVar6;
      lStack_270 = plVar2[3];
    }
    else {
      local_278 = *plVar6;
      local_288 = (long *)*plVar2;
    }
    local_280 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_1a0 = &local_190;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_190 = *plVar6;
      lStack_188 = plVar2[3];
    }
    else {
      local_190 = *plVar6;
      local_1a0 = (long *)*plVar2;
    }
    local_198 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1a0,*(ulong *)(lVar9 + 0x28));
    local_208 = &local_1f8;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1f8 = *plVar6;
      lStack_1f0 = plVar2[3];
    }
    else {
      local_1f8 = *plVar6;
      local_208 = (long *)*plVar2;
    }
    local_200 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_1e8 = &local_1d8;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1d8 = *plVar6;
      lStack_1d0 = plVar2[3];
    }
    else {
      local_1d8 = *plVar6;
      local_1e8 = (long *)*plVar2;
    }
    local_1e0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1e8,*(ulong *)(lVar9 + 0x28));
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar2[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar2;
    }
    local_138 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_140);
    local_268 = &local_258;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_258 = *plVar6;
      lStack_250 = plVar2[3];
    }
    else {
      local_258 = *plVar6;
      local_268 = (long *)*plVar2;
    }
    local_260 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_268,shader_start_abi_cxx11_);
    std::operator+(&local_228,"    light1 x = light1(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar9 + 0x28));
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_288 = &local_278;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_278 = *plVar6;
      lStack_270 = plVar2[3];
    }
    else {
      local_278 = *plVar6;
      local_288 = (long *)*plVar2;
    }
    local_280 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_288,*(ulong *)(lVar9 + 0x28));
    local_1a0 = &local_190;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_190 = *plVar6;
      lStack_188 = plVar2[3];
    }
    else {
      local_190 = *plVar6;
      local_1a0 = (long *)*plVar2;
    }
    local_198 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    local_208 = &local_1f8;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1f8 = *plVar6;
      lStack_1f0 = plVar2[3];
    }
    else {
      local_1f8 = *plVar6;
      local_208 = (long *)*plVar2;
    }
    local_200 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_208,*(ulong *)(lVar9 + 0x28));
    local_1e8 = &local_1d8;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_1d8 = *plVar6;
      lStack_1d0 = plVar2[3];
    }
    else {
      local_1d8 = *plVar6;
      local_1e8 = (long *)*plVar2;
    }
    local_1e0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar2[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar2;
    }
    local_138 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_268);
    puVar3 = &set_tesseation_abi_cxx11_;
    switch(local_1c4) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_268);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar3 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_268,*puVar3);
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xb86);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_268,shader_end_abi_cxx11_);
    (*(local_60->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[8])(local_60,(ulong)local_1c4,&local_268);
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    lVar8 = local_58 + 1;
    if (lVar8 == 0xf) {
      return;
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xb8d);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsTypeRestrictions2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " sampler1;\n"
																								"uniform " +
				var_iterator->second.precision + " " + var_iterator->second.type + " sampler2;\n"
																				   "uniform " +
				var_iterator->second.precision + " " + var_iterator->second.type + " sampler3;\n"
																				   "uniform " +
				var_iterator->second.precision + " " + var_iterator->second.type + " sampler4;\n"
																				   "struct light1 {\n"
																				   "    " +
				var_iterator->second.type + " var1[2][2];\n"
											"};\n\n";
			shader_source += shader_start;

			shader_source +=
				("    light1 x = light1(" + var_iterator->second.type + "[][](" + var_iterator->second.type +
				 "[](sampler1, sampler2), " + var_iterator->second.type + "[](sampler3, sampler4)));\n");
			shader_source += "    light1 y = x;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}